

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPServer.cpp
# Opt level: O0

void __thiscall net_uv::KCPServer::KCPServer(KCPServer *this)

{
  KCPServer *this_local;
  
  Server::Server(&this->super_Server);
  (this->super_Server).super_Runnable._vptr_Runnable = (_func_int **)&PTR__KCPServer_0020ffd8;
  (this->super_Server).super_SessionManager._vptr_SessionManager =
       (_func_int **)&PTR__KCPServer_00210078;
  this->m_start = false;
  this->m_server = (KCPSocket *)0x0;
  std::
  map<unsigned_int,_net_uv::KCPServer::serverSessionData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
  ::map(&this->m_allSession);
  return;
}

Assistant:

KCPServer::KCPServer()
	: m_start(false)
	, m_server(NULL)
{
}